

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

unsigned_long_long
pugi::impl::anon_unknown_0::get_value_ullong(char_t *value,unsigned_long_long def)

{
  int __base;
  int base;
  unsigned_long_long def_local;
  char_t *value_local;
  
  value_local = (char_t *)def;
  if (value != (char_t *)0x0) {
    __base = get_integer_base(value);
    value_local = (char_t *)strtoull(value,(char **)0x0,__base);
  }
  return (unsigned_long_long)value_local;
}

Assistant:

PUGI__FN unsigned long long get_value_ullong(const char_t* value, unsigned long long def)
	{
		if (!value) return def;

		int base = get_integer_base(value);

	#ifdef PUGIXML_WCHAR_MODE
		#ifdef PUGI__MSVC_CRT_VERSION
			return _wcstoui64(value, 0, base);
		#else
			return wcstoull(value, 0, base);
		#endif
	#else
		#ifdef PUGI__MSVC_CRT_VERSION
			return _strtoui64(value, 0, base);
		#else
			return strtoull(value, 0, base);
		#endif
	#endif
	}